

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O2

void __thiscall ClipperLib::Clipper::IntersectEdges(Clipper *this,TEdge *e1,TEdge *e2,IntPoint *Pt)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  PolyType PVar4;
  PolyType PVar5;
  int iVar6;
  PolyFillType PVar7;
  PolyFillType PVar8;
  EdgeSide EVar9;
  PolyFillType PVar10;
  PolyFillType PVar11;
  PolyFillType PVar12;
  ulong uVar13;
  int iVar14;
  ulong uVar15;
  TEdge *e;
  int iVar16;
  ulong uVar17;
  uint uVar18;
  ulong uVar19;
  
  iVar1 = e1->WindDelta;
  uVar2 = e1->OutIdx;
  iVar14 = e2->WindDelta;
  uVar3 = e2->OutIdx;
  if (iVar1 == 0) {
    if (iVar14 == 0) {
      return;
    }
    if (e1->PolyTyp != e2->PolyTyp) {
      if ((e2->WindCnt + 1U & 0xfffffffd) != 0) {
        return;
      }
      if ((this->m_ClipType == ctUnion) && (e2->WindCnt2 != 0)) {
        return;
      }
      goto LAB_0027c8e1;
    }
  }
  else {
    PVar4 = e1->PolyTyp;
    PVar5 = e2->PolyTyp;
    if (iVar14 != 0) {
      if (PVar4 == PVar5) {
        iVar6 = e1->WindCnt;
        if ((&this->m_ClipFillType)[PVar4 == ptSubject] == pftEvenOdd) {
          e1->WindCnt = e2->WindCnt;
          e2->WindCnt = iVar6;
        }
        else {
          iVar16 = -iVar6;
          if (iVar14 + iVar6 != 0) {
            iVar16 = iVar14 + iVar6;
          }
          e1->WindCnt = iVar16;
          iVar14 = e2->WindCnt - iVar1;
          if (iVar14 == 0) {
            e2->WindCnt = -iVar1;
          }
          else {
            e2->WindCnt = iVar14;
          }
        }
      }
      else {
        uVar18 = (uint)(e1->WindCnt2 == 0);
        if ((&this->m_ClipFillType)[PVar5 == ptSubject] != pftEvenOdd) {
          uVar18 = iVar14 + e1->WindCnt2;
        }
        e1->WindCnt2 = uVar18;
        if ((&this->m_ClipFillType)[PVar4 == ptSubject] == pftEvenOdd) {
          e2->WindCnt2 = (uint)(e2->WindCnt2 == 0);
        }
        else {
          e2->WindCnt2 = e2->WindCnt2 - iVar1;
        }
      }
      PVar7 = this->m_ClipFillType;
      PVar8 = this->m_SubjFillType;
      PVar10 = PVar7;
      PVar12 = PVar8;
      if (PVar4 == ptSubject) {
        PVar10 = PVar8;
        PVar12 = PVar7;
      }
      PVar11 = PVar7;
      if (PVar5 == ptSubject) {
        PVar11 = PVar8;
        PVar8 = PVar7;
      }
      uVar18 = e1->WindCnt;
      uVar13 = (ulong)(int)uVar18;
      if (PVar10 == pftNegative) {
        uVar13 = (ulong)(int)-uVar18;
      }
      else if (PVar10 != pftPositive) {
        if ((int)uVar18 < 1) {
          uVar18 = -uVar18;
        }
        uVar13 = (ulong)uVar18;
      }
      uVar18 = e2->WindCnt;
      uVar15 = (ulong)(int)uVar18;
      if (PVar11 == pftNegative) {
        uVar15 = (ulong)(int)-uVar18;
      }
      else if (PVar11 != pftPositive) {
        if ((int)uVar18 < 1) {
          uVar18 = -uVar18;
        }
        uVar15 = (ulong)uVar18;
      }
      if ((int)(uVar2 | uVar3) < 0) {
        e = e1;
        uVar17 = uVar15;
        if ((-1 < (int)uVar2) || (e = e2, uVar17 = uVar13, -1 < (int)uVar3)) {
          if (1 < uVar17) {
            return;
          }
          goto LAB_0027c8b0;
        }
        if (1 < uVar13) {
          return;
        }
        if (1 < uVar15) {
          return;
        }
        uVar2 = e1->WindCnt2;
        uVar17 = (ulong)(int)uVar2;
        if (PVar12 == pftNegative) {
          uVar17 = (ulong)(int)-uVar2;
        }
        else if (PVar12 != pftPositive) {
          if ((int)uVar2 < 1) {
            uVar2 = -uVar2;
          }
          uVar17 = (ulong)uVar2;
        }
        uVar2 = e2->WindCnt2;
        uVar19 = (ulong)(int)uVar2;
        if (PVar8 == pftNegative) {
          uVar19 = (ulong)(int)-uVar2;
        }
        else if (PVar8 != pftPositive) {
          if ((int)uVar2 < 1) {
            uVar2 = -uVar2;
          }
          uVar19 = (ulong)uVar2;
        }
        if (PVar4 != PVar5) goto switchD_0027c980_caseD_3;
        if ((uVar13 != 1) || (uVar15 != 1)) {
          EVar9 = e1->Side;
          e1->Side = e2->Side;
          e2->Side = EVar9;
          return;
        }
        switch(this->m_ClipType) {
        case ctIntersection:
          if ((0 < (long)uVar17) && (0 < (long)uVar19)) goto switchD_0027c980_caseD_3;
          break;
        case ctDifference:
          if (((PVar4 == ptClip) && (0 < (long)uVar17)) && (0 < (long)uVar19))
          goto switchD_0027c980_caseD_3;
          if (PVar4 != ptSubject) {
            return;
          }
        case ctUnion:
          if (((long)uVar17 < 1) && ((long)uVar19 < 1)) {
switchD_0027c980_caseD_3:
            AddLocalMinPoly(this,e1,e2,Pt);
            return;
          }
          break;
        case ctXor:
          goto switchD_0027c980_caseD_3;
        }
      }
      else {
        if (((1 < uVar13) || (1 < uVar15)) || ((PVar4 != PVar5 && (this->m_ClipType != ctXor)))) {
          AddLocalMaxPoly(this,e1,e2,Pt);
          return;
        }
        AddOutPt(this,e1,Pt);
        e = e2;
LAB_0027c8b0:
        AddOutPt(this,e,Pt);
        EVar9 = e1->Side;
        e1->Side = e2->Side;
        e2->Side = EVar9;
        iVar1 = e1->OutIdx;
        e1->OutIdx = e2->OutIdx;
        e2->OutIdx = iVar1;
      }
      return;
    }
    iVar14 = 0;
    if (PVar4 != PVar5) {
      if ((e1->WindCnt + 1U & 0xfffffffd) != 0) {
        return;
      }
      if ((this->m_ClipType == ctUnion) && (e1->WindCnt2 != 0)) {
        return;
      }
      goto LAB_0027c798;
    }
  }
  if (iVar1 == iVar14) {
    return;
  }
  if (this->m_ClipType != ctUnion) {
    return;
  }
  if (iVar1 != 0) {
    if ((int)uVar2 < 0) {
      return;
    }
LAB_0027c798:
    AddOutPt(this,e2,Pt);
    if ((int)uVar3 < 0) {
      return;
    }
    e2->OutIdx = -1;
    return;
  }
  if ((int)uVar3 < 0) {
    return;
  }
LAB_0027c8e1:
  AddOutPt(this,e1,Pt);
  if ((int)uVar2 < 0) {
    return;
  }
  e1->OutIdx = -1;
  return;
}

Assistant:

void Clipper::IntersectEdges(TEdge *e1, TEdge *e2, IntPoint &Pt)
{
  bool e1Contributing = ( e1->OutIdx >= 0 );
  bool e2Contributing = ( e2->OutIdx >= 0 );

#ifdef use_xyz
        SetZ(Pt, *e1, *e2);
#endif

#ifdef use_lines
  //if either edge is on an OPEN path ...
  if (e1->WindDelta == 0 || e2->WindDelta == 0)
  {
    //ignore subject-subject open path intersections UNLESS they
    //are both open paths, AND they are both 'contributing maximas' ...
	if (e1->WindDelta == 0 && e2->WindDelta == 0) return;

    //if intersecting a subj line with a subj poly ...
    else if (e1->PolyTyp == e2->PolyTyp && 
      e1->WindDelta != e2->WindDelta && m_ClipType == ctUnion)
    {
      if (e1->WindDelta == 0)
      {
        if (e2Contributing)
        {
          AddOutPt(e1, Pt);
          if (e1Contributing) e1->OutIdx = Unassigned;
        }
      }
      else
      {
        if (e1Contributing)
        {
          AddOutPt(e2, Pt);
          if (e2Contributing) e2->OutIdx = Unassigned;
        }
      }
    }
    else if (e1->PolyTyp != e2->PolyTyp)
    {
      //toggle subj open path OutIdx on/off when Abs(clip.WndCnt) == 1 ...
      if ((e1->WindDelta == 0) && abs(e2->WindCnt) == 1 && 
        (m_ClipType != ctUnion || e2->WindCnt2 == 0))
      {
        AddOutPt(e1, Pt);
        if (e1Contributing) e1->OutIdx = Unassigned;
      }
      else if ((e2->WindDelta == 0) && (abs(e1->WindCnt) == 1) && 
        (m_ClipType != ctUnion || e1->WindCnt2 == 0))
      {
        AddOutPt(e2, Pt);
        if (e2Contributing) e2->OutIdx = Unassigned;
      }
    }
    return;
  }
#endif

  //update winding counts...
  //assumes that e1 will be to the Right of e2 ABOVE the intersection
  if ( e1->PolyTyp == e2->PolyTyp )
  {
    if ( IsEvenOddFillType( *e1) )
    {
      int oldE1WindCnt = e1->WindCnt;
      e1->WindCnt = e2->WindCnt;
      e2->WindCnt = oldE1WindCnt;
    } else
    {
      if (e1->WindCnt + e2->WindDelta == 0 ) e1->WindCnt = -e1->WindCnt;
      else e1->WindCnt += e2->WindDelta;
      if ( e2->WindCnt - e1->WindDelta == 0 ) e2->WindCnt = -e2->WindCnt;
      else e2->WindCnt -= e1->WindDelta;
    }
  } else
  {
    if (!IsEvenOddFillType(*e2)) e1->WindCnt2 += e2->WindDelta;
    else e1->WindCnt2 = ( e1->WindCnt2 == 0 ) ? 1 : 0;
    if (!IsEvenOddFillType(*e1)) e2->WindCnt2 -= e1->WindDelta;
    else e2->WindCnt2 = ( e2->WindCnt2 == 0 ) ? 1 : 0;
  }

  PolyFillType e1FillType, e2FillType, e1FillType2, e2FillType2;
  if (e1->PolyTyp == ptSubject)
  {
    e1FillType = m_SubjFillType;
    e1FillType2 = m_ClipFillType;
  } else
  {
    e1FillType = m_ClipFillType;
    e1FillType2 = m_SubjFillType;
  }
  if (e2->PolyTyp == ptSubject)
  {
    e2FillType = m_SubjFillType;
    e2FillType2 = m_ClipFillType;
  } else
  {
    e2FillType = m_ClipFillType;
    e2FillType2 = m_SubjFillType;
  }

  cInt e1Wc, e2Wc;
  switch (e1FillType)
  {
    case pftPositive: e1Wc = e1->WindCnt; break;
    case pftNegative: e1Wc = -e1->WindCnt; break;
    default: e1Wc = Abs(e1->WindCnt);
  }
  switch(e2FillType)
  {
    case pftPositive: e2Wc = e2->WindCnt; break;
    case pftNegative: e2Wc = -e2->WindCnt; break;
    default: e2Wc = Abs(e2->WindCnt);
  }

  if ( e1Contributing && e2Contributing )
  {
    if ((e1Wc != 0 && e1Wc != 1) || (e2Wc != 0 && e2Wc != 1) ||
      (e1->PolyTyp != e2->PolyTyp && m_ClipType != ctXor) )
    {
      AddLocalMaxPoly(e1, e2, Pt); 
    }
    else
    {
      AddOutPt(e1, Pt);
      AddOutPt(e2, Pt);
      SwapSides( *e1 , *e2 );
      SwapPolyIndexes( *e1 , *e2 );
    }
  }
  else if ( e1Contributing )
  {
    if (e2Wc == 0 || e2Wc == 1) 
    {
      AddOutPt(e1, Pt);
      SwapSides(*e1, *e2);
      SwapPolyIndexes(*e1, *e2);
    }
  }
  else if ( e2Contributing )
  {
    if (e1Wc == 0 || e1Wc == 1) 
    {
      AddOutPt(e2, Pt);
      SwapSides(*e1, *e2);
      SwapPolyIndexes(*e1, *e2);
    }
  } 
  else if ( (e1Wc == 0 || e1Wc == 1) && (e2Wc == 0 || e2Wc == 1))
  {
    //neither edge is currently contributing ...

    cInt e1Wc2, e2Wc2;
    switch (e1FillType2)
    {
      case pftPositive: e1Wc2 = e1->WindCnt2; break;
      case pftNegative : e1Wc2 = -e1->WindCnt2; break;
      default: e1Wc2 = Abs(e1->WindCnt2);
    }
    switch (e2FillType2)
    {
      case pftPositive: e2Wc2 = e2->WindCnt2; break;
      case pftNegative: e2Wc2 = -e2->WindCnt2; break;
      default: e2Wc2 = Abs(e2->WindCnt2);
    }

    if (e1->PolyTyp != e2->PolyTyp)
    {
      AddLocalMinPoly(e1, e2, Pt);
    }
    else if (e1Wc == 1 && e2Wc == 1)
      switch( m_ClipType ) {
        case ctIntersection:
          if (e1Wc2 > 0 && e2Wc2 > 0)
            AddLocalMinPoly(e1, e2, Pt);
          break;
        case ctUnion:
          if ( e1Wc2 <= 0 && e2Wc2 <= 0 )
            AddLocalMinPoly(e1, e2, Pt);
          break;
        case ctDifference:
          if (((e1->PolyTyp == ptClip) && (e1Wc2 > 0) && (e2Wc2 > 0)) ||
              ((e1->PolyTyp == ptSubject) && (e1Wc2 <= 0) && (e2Wc2 <= 0)))
                AddLocalMinPoly(e1, e2, Pt);
          break;
        case ctXor:
          AddLocalMinPoly(e1, e2, Pt);
      }
    else
      SwapSides( *e1, *e2 );
  }
}